

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall CVmConsole::open_command_log(CVmConsole *this,char *fname,int event_script)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  char *in_RSI;
  err_frame_t err_cur__;
  CVmNetFile *nf;
  uint local_100 [3];
  CVmNetFile *in_stack_ffffffffffffff10;
  CVmNetFile *pCVar6;
  CVmConsole *in_stack_ffffffffffffff18;
  
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  unique0x00012000 = *puVar4;
  plVar5 = (long *)_ZTW11G_err_frame();
  *plVar5 = (long)local_100;
  local_100[0] = _setjmp((__jmp_buf_tag *)&stack0xffffffffffffff18);
  if (local_100[0] == 0) {
    CVmNetFile::open(in_RSI,0,0xe,5,"text/plain");
  }
  uVar2 = stack0xffffffffffffff08;
  if (local_100[0] == 1) {
    local_100[0] = 2;
  }
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  *puVar4 = uVar2;
  if ((local_100[0] & 0x4001) != 0) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    pCVar6 = in_stack_ffffffffffffff10;
    if ((*(uint *)*puVar4 & 2) != 0) {
      plVar5 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar5 + 0x10));
      pCVar6 = in_stack_ffffffffffffff10;
    }
    in_stack_ffffffffffffff10 = pCVar6;
    plVar5 = (long *)_ZTW11G_err_frame();
    *(CVmNetFile **)(*plVar5 + 0x10) = pCVar6;
    err_rethrow();
  }
  if ((local_100[0] & 2) != 0) {
    free(in_stack_ffffffffffffff10);
  }
  uVar2 = stack0xffffffffffffff08;
  uVar1 = (ulong)stack0xffffffffffffff08 >> 0x20;
  iVar3 = (int)uVar1;
  unique0x10000154 = uVar2;
  iVar3 = open_command_log(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,iVar3);
  return iVar3;
}

Assistant:

int CVmConsole::open_command_log(VMG_ const char *fname, int event_script)
{
    CVmNetFile *nf = 0;
    err_try
    {
        /* create the network file descriptor */
        nf = CVmNetFile::open(vmg_ fname, 0, NETF_NEW, OSFTCMD, "text/plain");
    }